

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O3

void __thiscall
FactorTimer::reportFactorLevel0Clock(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> factor_clock_list;
  allocator_type local_59;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_40;
  int local_28 [4];
  
  local_28[0] = 0;
  local_28[1] = 0x26;
  local_28[2] = 5;
  local_28[3] = 0x19;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_59);
  std::vector<int,_std::allocator<int>_>::vector(&local_58,&local_40);
  reportFactorClockList(this,"FactorLevel0",factor_timer_clock,&local_58);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reportFactorLevel0Clock(HighsTimerClock& factor_timer_clock) {
    std::vector<HighsInt> factor_clock_list{FactorInvert, FactorReinvert,
                                            FactorFtran, FactorBtran};
    reportFactorClockList("FactorLevel0", factor_timer_clock,
                          factor_clock_list);
  }